

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O0

void __thiscall
dtc::fdt::property::property(property *this,input_buffer *structs,input_buffer *strings)

{
  bool bVar1;
  bool local_129;
  uint local_104;
  undefined1 local_100 [4];
  uint32_t i;
  undefined1 local_e0 [8];
  property_value v;
  undefined1 local_78 [7];
  uint8_t byte;
  undefined4 local_54;
  undefined1 local_50 [8];
  input_buffer name_buffer;
  uint local_28;
  uint local_24;
  uint32_t length;
  uint32_t name_offset;
  input_buffer *strings_local;
  input_buffer *structs_local;
  property *this_local;
  
  _length = strings;
  strings_local = structs;
  structs_local = (input_buffer *)this;
  std::__cxx11::string::string((string *)this);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->labels);
  std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::vector
            (&this->values);
  bVar1 = input_buffer::consume_binary<unsigned_int>(strings_local,&local_28);
  local_129 = false;
  if (bVar1) {
    local_129 = input_buffer::consume_binary<unsigned_int>(strings_local,&local_24);
  }
  this->valid = local_129;
  if ((this->valid & 1U) == 0) {
    fprintf(_stderr,"Failed to read property\n");
  }
  else {
    input_buffer::buffer_from_offset((input_buffer *)local_50,_length,local_24,0);
    bVar1 = input_buffer::finished((input_buffer *)local_50);
    if (bVar1) {
      fprintf(_stderr,"Property name offset %u is past the end of the strings table\n",
              (ulong)local_24);
      this->valid = false;
      local_54 = 1;
    }
    else {
      input_buffer::parse_to_abi_cxx11_((string *)local_78,(input_buffer *)local_50,'\0');
      std::__cxx11::string::operator=((string *)this,(string *)local_78);
      std::__cxx11::string::~string((string *)local_78);
      if (local_28 == 0) {
        local_54 = 1;
      }
      else {
        std::__cxx11::string::string((string *)local_100);
        property_value::property_value((property_value *)local_e0,(string *)local_100);
        std::__cxx11::string::~string((string *)local_100);
        for (local_104 = 0; local_104 < local_28; local_104 = local_104 + 1) {
          bVar1 = input_buffer::consume_binary<unsigned_char>(strings_local,&v.field_0x5f);
          this->valid = bVar1;
          if (!bVar1) {
            fprintf(_stderr,"Failed to read property value\n");
            local_54 = 1;
            goto LAB_0018117e;
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     ((long)&v.string_data.field_2 + 8),&v.field_0x5f);
        }
        std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::push_back
                  (&this->values,(value_type *)local_e0);
        local_54 = 0;
LAB_0018117e:
        property_value::~property_value((property_value *)local_e0);
      }
    }
    input_buffer::~input_buffer((input_buffer *)local_50);
  }
  return;
}

Assistant:

property::property(input_buffer &structs, input_buffer &strings)
{
	uint32_t name_offset;
	uint32_t length;
	valid = structs.consume_binary(length) &&
		structs.consume_binary(name_offset);
	if (!valid)
	{
		fprintf(stderr, "Failed to read property\n");
		return;
	}
	// Find the name
	input_buffer name_buffer = strings.buffer_from_offset(name_offset);
	if (name_buffer.finished())
	{
		fprintf(stderr, "Property name offset %" PRIu32
			" is past the end of the strings table\n",
			name_offset);
		valid = false;
		return;
	}
	key = name_buffer.parse_to(0);

	// If we're empty, do not push anything as value.
	if (!length)
		return;

	// Read the value
	uint8_t byte;
	property_value v;
	for (uint32_t i=0 ; i<length ; i++)
	{
		if (!(valid = structs.consume_binary(byte)))
		{
			fprintf(stderr, "Failed to read property value\n");
			return;
		}
		v.byte_data.push_back(byte);
	}
	values.push_back(v);
}